

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::GenerateTargetManifest(cmLocalGenerator *this)

{
  cmGeneratorTarget *this_00;
  cmTarget *pcVar1;
  _Base_ptr p_Var2;
  pointer pbVar3;
  allocator local_b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  cmGeneratorTargetsType targets;
  string local_70;
  string local_50;
  
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  configNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations(&local_50,this->Makefile,&configNames,true);
  std::__cxx11::string::~string((string *)&local_50);
  if (configNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      configNames.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&targets,"",(allocator *)&local_70);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&configNames,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&targets);
    std::__cxx11::string::~string((string *)&targets);
  }
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::_Rb_tree(&targets._M_t,&(this->Makefile->GeneratorTargets)._M_t);
  for (p_Var2 = targets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &targets._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    this_00 = (cmGeneratorTarget *)p_Var2[1]._M_parent;
    pcVar1 = this_00->Target;
    if ((pcVar1->TargetTypeValue != INTERFACE_LIBRARY) &&
       (pbVar3 = configNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, pcVar1->IsImportedTarget == false)) {
      for (; pbVar3 != configNames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
        std::__cxx11::string::string((string *)&local_70,(pbVar3->_M_dataplus)._M_p,&local_b9);
        cmGeneratorTarget::GenerateTargetManifest(this_00,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
  }
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree(&targets._M_t);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&configNames);
  return;
}

Assistant:

void cmLocalGenerator::GenerateTargetManifest()
{
  // Collect the set of configuration types.
  std::vector<std::string> configNames;
  this->Makefile->GetConfigurations(configNames);
  if(configNames.empty())
    {
    configNames.push_back("");
    }

  // Add our targets to the manifest for each configuration.
  cmGeneratorTargetsType targets = this->Makefile->GetGeneratorTargets();
  for(cmGeneratorTargetsType::iterator t = targets.begin();
      t != targets.end(); ++t)
    {
    cmGeneratorTarget& target = *t->second;
    if (target.Target->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    if (target.Target->IsImported())
      {
      continue;
      }
    for(std::vector<std::string>::iterator ci = configNames.begin();
        ci != configNames.end(); ++ci)
      {
      const char* config = ci->c_str();
      target.GenerateTargetManifest(config);
      }
    }
}